

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

bool __thiscall QWizard::validateCurrentPage(QWizard *this)

{
  byte bVar1;
  QWizardPage *pQVar2;
  QWizard *in_RDI;
  QWizardPage *page;
  bool local_1;
  
  pQVar2 = currentPage(in_RDI);
  if (pQVar2 == (QWizardPage *)0x0) {
    local_1 = true;
  }
  else {
    bVar1 = (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1b0))();
    local_1 = (bool)(bVar1 & 1);
  }
  return local_1;
}

Assistant:

bool QWizard::validateCurrentPage()
{
    QWizardPage *page = currentPage();
    if (!page)
        return true;

    return page->validatePage();
}